

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_context * ggml_init(ggml_init_params params)

{
  ggml_context *__dest;
  void *in_RSI;
  size_t in_RDI;
  double dVar1;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar2 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [12];
  int i_2;
  ggml_context *ctx;
  uint64_t t_end_1;
  int i_1;
  uint64_t t_start_1;
  uint64_t t_end;
  float f;
  uint16_t ui;
  int i;
  ggml_fp16_t ii;
  uint64_t t_start;
  undefined8 in_stack_ffffffffffffe690;
  float x;
  size_t local_1940;
  void *local_1938;
  undefined1 local_1930;
  int local_18e4;
  ggml_context *local_18e0;
  int64_t local_18d8;
  int local_18cc;
  undefined1 local_18c8 [6144];
  int64_t local_c8;
  int64_t local_c0;
  undefined1 local_b8 [16];
  ggml_fp16_t local_9a;
  undefined1 local_98 [16];
  ggml_fp16_t local_7a;
  undefined1 local_78 [16];
  ggml_fp16_t local_5a;
  float local_58;
  ushort local_52;
  int local_50;
  ushort local_4a;
  int64_t local_48;
  size_t local_40;
  void *local_38;
  ggml_context *local_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  ushort local_2;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_40 = in_RDI;
  local_38 = in_RSI;
  ggml_critical_section_start();
  if ((ggml_init::is_first_call & 1U) != 0) {
    local_48 = ggml_time_us();
    for (local_50 = 0; local_50 < 0x10000; local_50 = local_50 + 1) {
      local_52 = (ushort)local_50;
      local_4a = (ushort)local_50;
      local_2 = (ushort)local_50;
      local_18 = ZEXT216((ushort)local_50);
      local_28 = vcvtph2ps_f16c(ZEXT216((ushort)local_50));
      table_f32_f16[local_50] = (float)local_28._0_4_;
      local_58 = (float)local_28._0_4_;
      x = (float)((ulong)in_stack_ffffffffffffe690 >> 0x20);
      auVar4._0_4_ = ggml_gelu_f32(x);
      auVar4._4_60_ = extraout_var;
      auVar3._0_12_ = ZEXT412(0);
      auVar3._12_4_ = 0;
      local_78 = vblendps_avx(auVar3,auVar4._0_16_,1);
      auVar2 = vcvtps2ph_f16c(local_78,0);
      vpextrw_avx(auVar2,0);
      table_gelu_f16[local_50] = local_5a;
      auVar5._0_4_ = ggml_silu_f32(x);
      auVar5._4_60_ = extraout_var_00;
      local_98 = vblendps_avx(auVar3,auVar5._0_16_,1);
      auVar2 = vcvtps2ph_f16c(local_98,0);
      vpextrw_avx(auVar2,0);
      table_silu_f16[local_50] = local_7a;
      auVar6 = (undefined1  [12])0x0;
      dVar1 = exp((double)local_58);
      auVar2._0_4_ = (float)dVar1;
      auVar2._4_12_ = auVar6;
      local_b8 = vblendps_avx(auVar3,auVar2,1);
      auVar3 = vcvtps2ph_f16c(local_b8,0);
      local_9a = auVar3._0_2_;
      table_exp_f16[local_50] = local_9a;
    }
    local_c0 = ggml_time_us();
    local_c8 = ggml_time_us();
    memset(local_18c8,0,0x1800);
    memcpy(local_18c8,&DAT_001670d0,0x1800);
    memcpy(&g_state,local_18c8,0x1800);
    for (local_18cc = 0; local_18cc < 0x40; local_18cc = local_18cc + 1) {
      g_state.contexts[local_18cc].used = false;
    }
    local_18d8 = ggml_time_us();
    ggml_init::is_first_call = false;
  }
  local_18e0 = (ggml_context *)0x0;
  local_18e4 = 0;
  do {
    if (0x3f < local_18e4) {
LAB_00148b9e:
      __dest = local_18e0;
      if (local_18e0 == (ggml_context *)0x0) {
        ggml_critical_section_end();
        local_30 = (ggml_context *)0x0;
      }
      else {
        memset(&local_1940,0,0x58);
        local_1940 = local_40;
        local_1938 = local_38;
        if (local_38 == (void *)0x0) {
          local_1938 = malloc(local_40);
        }
        local_1930 = local_38 == (void *)0x0;
        memcpy(__dest,&local_1940,0x58);
        ggml_critical_section_end();
        local_30 = local_18e0;
      }
      return local_30;
    }
    if ((g_state.contexts[local_18e4].used & 1U) == 0) {
      g_state.contexts[local_18e4].used = true;
      local_18e0 = &g_state.contexts[local_18e4].context;
      goto LAB_00148b9e;
    }
    local_18e4 = local_18e4 + 1;
  } while( true );
}

Assistant:

struct ggml_context * ggml_init(struct ggml_init_params params) {
    // make this function thread safe
    ggml_critical_section_start();

    static bool is_first_call = true;

    if (is_first_call) {
        // initialize GELU, SILU and EXP F32 tables
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            ggml_fp16_t ii;
            for (int i = 0; i < (1 << 16); ++i) {
                uint16_t ui = i;
                memcpy(&ii, &ui, sizeof(ii));
                const float f = table_f32_f16[i] = GGML_COMPUTE_FP16_TO_FP32(ii);
                table_gelu_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_f32(f));
                table_silu_f16[i] = GGML_FP32_TO_FP16(ggml_silu_f32(f));
                table_exp_f16[i]  = GGML_FP32_TO_FP16(exp(f));
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: GELU, SILU and EXP tables initialized in %f ms\n", __func__, (t_end - t_start)/1000.0f);
        }

        // initialize g_state
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            g_state = (struct ggml_state) {
                /*.contexts =*/ { { 0 } },
            };

            for (int i = 0; i < GGML_MAX_CONTEXTS; ++i) {
                g_state.contexts[i].used = false;
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: g_state initialized in %f ms\n", __func__, (t_end - t_start)/1000.0f);
        }

        is_first_call = false;
    }

    // find non-used context in g_state
    struct ggml_context * ctx = NULL;

    for (int i = 0; i < GGML_MAX_CONTEXTS; i++) {
        if (!g_state.contexts[i].used) {
            g_state.contexts[i].used = true;
            ctx = &g_state.contexts[i].context;

            GGML_PRINT_DEBUG("%s: found unused context %d\n", __func__, i);
            break;
        }
    }

    if (ctx == NULL) {
        GGML_PRINT_DEBUG("%s: no unused context found\n", __func__);

        ggml_critical_section_end();

        return NULL;
    }

    *ctx = (struct ggml_context) {
        /*.mem_size         =*/ params.mem_size,
        /*.mem_buffer       =*/ params.mem_buffer ? params.mem_buffer : malloc(params.mem_size),
        /*.mem_buffer_owned =*/ params.mem_buffer ? false : true,
        /*.n_objects        =*/ 0,
        /*.objects_begin    =*/ NULL,
        /*.objects_end      =*/ NULL,
        /*.scratch          =*/ { 0, 0, NULL, },
        /*.scratch_save     =*/ { 0, 0, NULL, },
    };

    ggml_assert_aligned(ctx->mem_buffer);

    GGML_PRINT_DEBUG("%s: context initialized\n", __func__);

    ggml_critical_section_end();

    return ctx;
}